

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O0

uint2048 * from_issue_339::modInverse(uint2048 A,uint2048 M)

{
  uintwide_t *this;
  enable_if_t<std::is_integral<int>::value,_bool> eVar1;
  uintwide_t<2048U,_unsigned_int,_void,_false> *in_RDI;
  int local_1114;
  uintwide_t<4096U,_unsigned_int,_void,_false> local_1110;
  uintwide_t<4096U,_unsigned_int,_void,_false> local_f10;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_d10;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_c10;
  undefined1 local_b10 [8];
  uint4096 t;
  undefined1 local_810 [8];
  uint4096 q;
  undefined1 local_608 [8];
  uint4096 x;
  uint4096 y;
  uint4096 m0;
  
  this = (uintwide_t *)(A.values.super_array<unsigned_int,_64UL>.elems + 0x3e);
  math::wide_integer::uintwide_t::operator_cast_to_uintwide_t
            ((uintwide_t<4096U,_unsigned_int,_void,_false> *)
             (y.values.super_array<unsigned_int,_128UL>.elems + 0x7e),this);
  math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<4096U,_unsigned_int,_void,_false> *)
             (x.values.super_array<unsigned_int,_128UL>.elems + 0x7e),0,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<4096U,_unsigned_int,_void,_false> *)local_608,1,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  q.values.super_array<unsigned_int,_128UL>.elems[0x7f] = 1;
  eVar1 = math::wide_integer::operator==
                    ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,
                     (int *)(q.values.super_array<unsigned_int,_128UL>.elems + 0x7f));
  if (eVar1) {
    math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::uintwide_t<int>
              (in_RDI,0,(enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *
                        )0x0);
  }
  else {
    while( true ) {
      q.values.super_array<unsigned_int,_128UL>.elems[0x7e] = 1;
      eVar1 = math::wide_integer::operator>
                        ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,
                         (int *)(q.values.super_array<unsigned_int,_128UL>.elems + 0x7e));
      if (!eVar1) break;
      math::wide_integer::operator/
                ((uintwide_t<2048U,_unsigned_int,_void,_false> *)
                 (t.values.super_array<unsigned_int,_128UL>.elems + 0x7e),
                 (uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,
                 (uintwide_t<2048U,_unsigned_int,_void,_false> *)this);
      math::wide_integer::uintwide_t::operator_cast_to_uintwide_t
                ((uintwide_t<4096U,_unsigned_int,_void,_false> *)local_810,
                 (uintwide_t *)(t.values.super_array<unsigned_int,_128UL>.elems + 0x7e));
      math::wide_integer::uintwide_t::operator_cast_to_uintwide_t
                ((uintwide_t<4096U,_unsigned_int,_void,_false> *)local_b10,this);
      math::wide_integer::operator%
                (&local_c10,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,
                 (uintwide_t<2048U,_unsigned_int,_void,_false> *)this);
      memcpy(this,&local_c10,0x100);
      math::wide_integer::uintwide_t::operator_cast_to_uintwide_t
                (&local_d10,(uintwide_t *)local_b10);
      memcpy((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000008,&local_d10,0x100);
      memcpy(local_b10,x.values.super_array<unsigned_int,_128UL>.elems + 0x7e,0x200);
      math::wide_integer::operator*
                (&local_1110,(uintwide_t<4096U,_unsigned_int,_void,_false> *)local_810,
                 (uintwide_t<4096U,_unsigned_int,_void,_false> *)
                 (x.values.super_array<unsigned_int,_128UL>.elems + 0x7e));
      math::wide_integer::operator-
                (&local_f10,(uintwide_t<4096U,_unsigned_int,_void,_false> *)local_608,&local_1110);
      memcpy(x.values.super_array<unsigned_int,_128UL>.elems + 0x7e,&local_f10,0x200);
      memcpy(local_608,local_b10,0x200);
    }
    local_1114 = 0;
    eVar1 = math::wide_integer::operator<
                      ((uintwide_t<4096U,_unsigned_int,_void,_false> *)local_608,&local_1114);
    if (eVar1) {
      math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::operator+=
                ((uintwide_t<4096U,_unsigned_int,_void,_false> *)local_608,
                 (uintwide_t<4096U,_unsigned_int,_void,_false> *)
                 (y.values.super_array<unsigned_int,_128UL>.elems + 0x7e));
    }
    math::wide_integer::uintwide_t::operator_cast_to_uintwide_t(in_RDI,(uintwide_t *)local_608);
  }
  return in_RDI;
}

Assistant:

auto modInverse(uint2048 A, uint2048 M) -> uint2048 // NOLINT(readability-identifier-naming)
  {
    uint4096 m0 = M;
    uint4096 y  = 0;
    uint4096 x  = 1;

    if(M == 1)
    {
      return 0; // LCOV_EXCL_LINE
    }

    while (A > 1)
    {
      uint4096 q = A / M;
      uint4096 t = M;

      M = A % M;
      A = t;
      t = y;

      y = x - q * y;
      x = t;
    }

    if (x < 0)
    {
      x += m0; // LCOV_EXCL_LINE
    }

    return x;
  }